

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_type_createAnonymousClass
          (sysbvm_context_t *context,sysbvm_tuple_t supertype,sysbvm_tuple_t metaclass)

{
  size_t sVar1;
  sysbvm_object_tuple_t *psVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_class_t *result;
  size_t classSlotCount;
  sysbvm_tuple_t metaclass_local;
  sysbvm_tuple_t supertype_local;
  sysbvm_context_t *context_local;
  
  sVar1 = sysbvm_type_getTotalSlotCount(metaclass);
  if (sVar1 < 0x1d) {
    sysbvm_error_assertionFailure
              (
              "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/type.c:82: assertion failure: classSlotCount >= SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_class_t)"
              );
  }
  psVar2 = sysbvm_context_allocatePointerTuple(context,metaclass,sVar1);
  psVar2[2].header.field_0.typePointer = supertype;
  sVar3 = sysbvm_tuple_size_encode(context,0);
  psVar2[3].field_1.pointers[0] = sVar3;
  sVar3 = sysbvm_tuple_size_encode(context,0);
  psVar2[4].header.field_0.typePointer = sVar3;
  sVar3 = sysbvm_tuple_size_encode(context,0);
  psVar2[4].header.identityHashAndFlags = (int)sVar3;
  psVar2[4].header.objectSize = (int)(sVar3 >> 0x20);
  sVar3 = sysbvm_tuple_bitflags_encode(1);
  psVar2[4].field_1.pointers[0] = sVar3;
  if (supertype != 0) {
    sVar1 = sysbvm_type_getTotalSlotCount(supertype);
    sVar3 = sysbvm_tuple_size_encode(context,sVar1);
    psVar2[3].field_1.pointers[0] = sVar3;
  }
  return (sysbvm_tuple_t)psVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_createAnonymousClass(sysbvm_context_t *context, sysbvm_tuple_t supertype, sysbvm_tuple_t metaclass)
{
    size_t classSlotCount = sysbvm_type_getTotalSlotCount(metaclass);
    SYSBVM_ASSERT(classSlotCount >= SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_class_t));

    sysbvm_class_t* result = (sysbvm_class_t*)sysbvm_context_allocatePointerTuple(context, metaclass, classSlotCount);
    result->super.supertype = supertype;
    result->super.totalSlotCount = sysbvm_tuple_size_encode(context, 0);
    result->super.instanceSize = sysbvm_tuple_size_encode(context, 0);
    result->super.instanceAlignment = sysbvm_tuple_size_encode(context, 0);
    result->super.flags = sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_FLAGS_CLASS_DEFAULT_FLAGS);
    if(supertype)
        result->super.totalSlotCount = sysbvm_tuple_size_encode(context, sysbvm_type_getTotalSlotCount(supertype));
    return (sysbvm_tuple_t)result;
}